

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int pager_lock_db(Pager *pPager,int eLock)

{
  char *zErr;
  int local_18;
  int rc;
  int eLock_local;
  Pager *pPager_local;
  
  local_18 = 0;
  if ((pPager->iLock < eLock) || (pPager->iLock == 0)) {
    local_18 = unqliteOsLock(pPager->pfd,eLock);
    if (local_18 == 0) {
      pPager->iLock = eLock;
    }
    else {
      zErr = "Error while requesting database lock";
      if (local_18 == -0xe) {
        zErr = "Another process or thread hold the requested lock";
      }
      unqliteGenError(pPager->pDb,zErr);
    }
  }
  return local_18;
}

Assistant:

static int pager_lock_db(Pager *pPager, int eLock){
  int rc = UNQLITE_OK;
  if( pPager->iLock < eLock || pPager->iLock == NO_LOCK ){
    rc = unqliteOsLock(pPager->pfd, eLock);
    if( rc==UNQLITE_OK ){
      pPager->iLock = eLock;
    }else{
		unqliteGenError(pPager->pDb,
			rc == UNQLITE_BUSY ? "Another process or thread hold the requested lock" : "Error while requesting database lock"
			);
	}
  }
  return rc;
}